

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_clock.cpp
# Opt level: O2

void __thiscall
sc_core::sc_clock::sc_clock
          (sc_clock *this,char *name_,double period_v_,sc_time_unit period_tu_,double duty_cycle_)

{
  sc_time local_38;
  
  sc_interface::sc_interface((sc_interface *)this);
  sc_signal<bool,_(sc_core::sc_writer_policy)0>::sc_signal
            (&this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>,&PTR_PTR_0025c3e8,name_);
  (this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
  super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_inout_if<bool>.
  super_sc_signal_in_if<bool> = (sc_signal_in_if<bool>)&PTR_register_port_0025c220;
  (this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
  super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_inout_if<bool>.
  super_sc_signal_write_if<bool> = (sc_signal_write_if<bool>)&DAT_0025c300;
  (this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
  super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_channel.
  super_sc_prim_channel.super_sc_object._vptr_sc_object = (_func_int **)&PTR_print_0025c340;
  (this->m_period).m_value = 0;
  this->m_duty_cycle = 0.0;
  *(undefined8 *)((long)&this->m_duty_cycle + 1) = 0;
  *(undefined8 *)((long)&(this->m_start_time).m_value + 1) = 0;
  (this->m_posedge_time).m_value = 0;
  (this->m_negedge_time).m_value = 0;
  sc_event::sc_event(&this->m_next_posedge_event,"next_posedge_event");
  sc_event::sc_event(&this->m_next_negedge_event,"next_negedge_event");
  sc_time::sc_time(&local_38,period_v_,period_tu_,
                   (this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
                   super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_channel.
                   super_sc_prim_channel.super_sc_object.m_simc);
  init(this,(EVP_PKEY_CTX *)&local_38);
  sc_event::notify_internal(&this->m_next_posedge_event,&this->m_start_time);
  return;
}

Assistant:

sc_clock::sc_clock( const char* name_,
		    double         period_v_,
		    sc_time_unit   period_tu_,
		    double         duty_cycle_ ) :
    base_type( name_ ),
    m_period(), m_duty_cycle(), m_start_time(), m_posedge_first(),
    m_posedge_time(), m_negedge_time(),
    m_next_posedge_event( sc_event::kernel_event, "next_posedge_event" ),
    m_next_negedge_event( sc_event::kernel_event, "next_negedge_event" )
{
    init( sc_time( period_v_, period_tu_, simcontext() ),
	  duty_cycle_,
	  SC_ZERO_TIME,
	  true );

    // posedge first
    m_next_posedge_event.notify_internal( m_start_time );
}